

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixxx.cc
# Opt level: O0

void __thiscall ixxx::ansi::basic::test_method(basic *this)

{
  undefined8 uVar1;
  bool bVar2;
  lazy_ostream *plVar3;
  undefined1 local_191;
  path local_190;
  undefined1 local_169;
  basic_cstring<const_char> local_168;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_158;
  basic_cstring<const_char> local_130;
  basic_cstring<const_char> local_120;
  int local_110;
  undefined1 local_109;
  int fd;
  undefined1 local_e1;
  basic_cstring<const_char> local_e0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_d0;
  basic_cstring<const_char> local_a8;
  basic_cstring<const_char> local_98;
  path local_88;
  path local_68;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string filename;
  basic *this_local;
  
  filename.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_30,"tmp/basic",&local_31);
  std::allocator<char>::~allocator(&local_31);
  boost::filesystem::path::path(&local_68,"tmp");
  boost::filesystem::create_directory(&local_68);
  boost::filesystem::path::~path(&local_68);
  boost::filesystem::path::path(&local_88,(string_type *)local_30);
  boost::filesystem::remove((char *)&local_88);
  boost::filesystem::path::~path(&local_88);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_98,
               "/workspace/llm4binary/github/license_all_cmakelists_25/gsauthof[P]libixxx/unittest/ixxx.cc"
               ,0x5a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_a8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_98,0x43,&local_a8);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_d0,plVar3,(char (*) [1])"");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/gsauthof[P]libixxx/unittest/ixxx.cc"
               ,0x5a);
    boost::filesystem::path::path((path *)&fd,(string_type *)local_30);
    local_e1 = boost::filesystem::exists((path *)&fd);
    local_109 = 0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (&local_d0,&local_e0,0x43,1,2,&local_e1,"fs::exists(filename)",&local_109,"false");
    boost::filesystem::path::~path((path *)&fd);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_d0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  local_110 = posix::open((posix *)local_30,(char *)0x41,0x1b6);
  posix::close(local_110);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_120,
               "/workspace/llm4binary/github/license_all_cmakelists_25/gsauthof[P]libixxx/unittest/ixxx.cc"
               ,0x5a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_130);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_120,0x46,&local_130);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_158,plVar3,(char (*) [1])"");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_168,
               "/workspace/llm4binary/github/license_all_cmakelists_25/gsauthof[P]libixxx/unittest/ixxx.cc"
               ,0x5a);
    boost::filesystem::path::path(&local_190,(string_type *)local_30);
    local_169 = boost::filesystem::exists(&local_190);
    local_191 = 1;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (&local_158,&local_168,0x46,1,2,&local_169,"fs::exists(filename)",&local_191,"true");
    boost::filesystem::path::~path(&local_190);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_158);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE( basic )
    {
      string filename("tmp/basic");
      fs::create_directory("tmp");
      fs::remove(filename);
      BOOST_CHECK_EQUAL(fs::exists(filename), false);
      int fd = posix::open(filename, O_CREAT | O_WRONLY, 0666);
      posix::close(fd);
      BOOST_CHECK_EQUAL(fs::exists(filename), true);
    }